

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * CompileVmClassPrototype(ExpressionContext *ctx,VmModule *module,ExprClassPrototype *node)

{
  VmValue *pVVar1;
  
  pVVar1 = anon_unknown.dwarf_11cad6::CreateVoid(module);
  pVVar1 = anon_unknown.dwarf_11cad6::CheckType(ctx,&node->super_ExprBase,pVVar1);
  return pVVar1;
}

Assistant:

VmValue* CompileVmClassPrototype(ExpressionContext &ctx, VmModule *module, ExprClassPrototype *node)
{
	return CheckType(ctx, node, CreateVoid(module));
}